

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_reader.cpp
# Opt level: O0

double duckdb::ParquetDecimalUtils::ReadDecimalValue<double>
                 (const_data_ptr_t pointer,idx_t size,ParquetColumnSchema *schema_ele)

{
  byte bVar1;
  unsigned_long uVar2;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  ulong in_RSI;
  byte *in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  data_t byte;
  idx_t k;
  uint8_t *res_ptr;
  uint64_t input;
  unsigned_long byte_size;
  idx_t i;
  bool positive;
  double res;
  ulong local_58;
  undefined8 local_48;
  unsigned_long local_40;
  ulong local_38;
  byte local_29;
  double local_28;
  long local_20;
  ulong local_18;
  byte *local_10;
  double local_8;
  
  local_20 = CONCAT71(in_register_00000011,in_DL);
  local_28 = 0.0;
  local_29 = (*in_RDI & 0x80) == 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  for (local_38 = 0; local_38 < local_18; local_38 = local_38 + 8) {
    local_40 = MinValue<unsigned_long>(8,local_18 - local_38);
    local_48 = 0;
    for (local_58 = 0; local_58 < local_40; local_58 = local_58 + 1) {
      bVar1 = local_10[local_38 + local_58];
      if ((local_29 & 1) == 0) {
        bVar1 = bVar1 ^ 0xff;
      }
      *(byte *)((long)&local_48 + (7 - local_58)) = bVar1;
    }
    uVar2 = NumericLimits<unsigned_long>::Maximum();
    auVar5._8_4_ = (int)(uVar2 >> 0x20);
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = 0x45300000;
    auVar4._8_4_ = (int)((ulong)local_48 >> 0x20);
    auVar4._0_8_ = local_48;
    auVar4._12_4_ = 0x45300000;
    local_28 = (auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0) +
               local_28 *
               ((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) + 1.0);
  }
  if ((local_29 & 1) == 0) {
    local_28 = local_28 + 1.0;
    dVar3 = pow(10.0,(double)*(uint *)(local_20 + 0x6c));
    local_8 = -(local_28 / dVar3);
  }
  else {
    local_8 = pow(10.0,(double)*(uint *)(local_20 + 0x6c));
    local_8 = local_28 / local_8;
  }
  return local_8;
}

Assistant:

double ParquetDecimalUtils::ReadDecimalValue(const_data_ptr_t pointer, idx_t size,
                                             const ParquetColumnSchema &schema_ele) {
	double res = 0;
	bool positive = (*pointer & 0x80) == 0;
	for (idx_t i = 0; i < size; i += 8) {
		auto byte_size = MinValue<idx_t>(sizeof(uint64_t), size - i);
		uint64_t input = 0;
		auto res_ptr = reinterpret_cast<uint8_t *>(&input);
		for (idx_t k = 0; k < byte_size; k++) {
			auto byte = pointer[i + k];
			res_ptr[sizeof(uint64_t) - k - 1] = positive ? byte : byte ^ 0xFF;
		}
		res *= double(NumericLimits<uint64_t>::Maximum()) + 1;
		res += static_cast<double>(input);
	}
	if (!positive) {
		res += 1;
		res /= pow(10, schema_ele.type_scale);
		return -res;
	}
	res /= pow(10, schema_ele.type_scale);
	return res;
}